

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distorm.c
# Opt level: O0

void distorm_format64(_CodeInfo *ci,_DInst *di,_DecodedInst *result)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  ulong *in_RDX;
  _DInst *in_RSI;
  undefined8 *in_RDI;
  bool bVar8;
  bool bVar9;
  _OffsetType offset_1;
  uint size_1;
  uint prefix;
  uint opcode;
  int segment;
  int isDefault;
  uint type;
  _OffsetType offset;
  uint byte;
  uint size;
  uint i;
  int suffixSize;
  _WMnemonic *mnemonic;
  uint64_t addrMask;
  int64_t tmpDisp64;
  uchar *str;
  uint local_74;
  uint64_t in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint local_40;
  uint local_3c;
  ulong local_30;
  uint8_t *local_20;
  ulong *local_18;
  _DInst *local_10;
  undefined8 *local_8;
  
  local_30 = 0xffffffffffffffff;
  local_3c = 0xffffffff;
  if ((*(uint *)(in_RDI + 5) & 0x8000) == 0) {
    if ((*(uint *)(in_RDI + 5) & 2) == 0) {
      if ((*(uint *)(in_RDI + 5) & 1) != 0) {
        local_30 = 0xffff;
      }
    }
    else {
      local_30 = 0xffffffff;
    }
  }
  else {
    local_30 = in_RDI[1];
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  str_hex((_WString *)((long)in_RDX + 0x74),
          (uint8_t *)(in_RDI[3] + (ulong)(uint)((int)in_RSI->addr - (int)*in_RDI)),
          (uint)in_RSI->size);
  if (local_10->flags == 0xffff) {
    bVar1 = local_10->size;
    bVar2 = (local_10->imm).byte;
    *local_18 = local_10->addr & local_30;
    *(uint *)(local_18 + 1) = (uint)bVar1;
    *(undefined4 *)(local_18 + 2) = 0x20204244;
    local_20 = (uint8_t *)((long)local_18 + 0x13);
    str_int_impl(&local_20,(ulong)bVar2);
    *local_20 = 0;
    *(int *)((long)local_18 + 0xc) = (int)local_20 - ((int)local_18 + 0x10);
    local_18[8] = 0;
    return;
  }
  local_20 = (uint8_t *)((long)local_18 + 0x44);
  if ((0x126 < local_10->opcode) && (local_10->opcode < 0x140)) {
    if ((0x80 < local_10->segment) &&
       (((int)(uint)local_10->flags >> 10 & 3U) == *(uint *)((long)local_8 + 0x24))) {
      local_3c = local_10->ops[0].size / 8;
      goto LAB_0010544d;
    }
    local_3c = 0;
  }
  local_74 = in_stack_ffffffffffffffa4;
  for (local_40 = 0; local_40 < local_10->opsNo; local_40 = local_40 + 1) {
    uVar3 = local_10->ops[local_40].type;
    if (local_40 != 0) {
      local_20[0] = ',';
      local_20[1] = ' ';
      local_20 = local_20 + 2;
    }
    if (uVar3 == '\x01') {
      strcat_WSR(&local_20,_REGISTERS + local_10->ops[local_40].index);
    }
    else if (uVar3 == '\x02') {
      if ((local_10->opcode == 0x10) && (local_10->ops[local_40].size != 8)) {
        distorm_format_size(&local_20,local_10,local_40);
      }
      if ((((local_10->flags & 0x20) == 0) || (local_10->ops[local_40].size != 8)) ||
         (-1 < (local_10->imm).sbyte)) {
        if (local_10->ops[local_40].size == 0x20) {
          str_int_impl(&local_20,(ulong)(local_10->imm).dword);
        }
        else {
          str_int_impl(&local_20,(local_10->imm).qword);
        }
      }
      else {
        *local_20 = '-';
        local_20 = local_20 + 1;
        str_int_impl(&local_20,(long)-(int)(local_10->imm).sbyte);
      }
    }
    else if (uVar3 == '\b') {
      str_int_impl(&local_20,
                   (ulong)local_10->size + (local_10->imm).sqword + local_10->addr & local_30);
    }
    else if (uVar3 == '\x05') {
      distorm_format_size(&local_20,local_10,local_40);
      *local_20 = '[';
      local_20 = local_20 + 1;
      if (local_10->segment < 0x81) {
        strcat_WSR(&local_20,_REGISTERS + (int)(local_10->segment & 0x7f));
        *local_20 = ':';
        local_20 = local_20 + 1;
      }
      str_int_impl(&local_20,local_10->disp & local_30);
      *local_20 = ']';
      local_20 = local_20 + 1;
    }
    else if (uVar3 == '\x06') {
      distorm_format_size(&local_20,local_10,local_40);
      *local_20 = '[';
      local_20 = local_20 + 1;
      if (local_10->segment == 0xff) {
        local_74 = 0xff;
      }
      else {
        local_74 = local_10->segment & 0x7f;
      }
      bVar8 = (char)local_10->segment < -1;
      if (local_3c == 0) {
        if (((local_10->opcode == 0x127) && (local_40 == 0)) ||
           ((local_10->opcode == 0x12d && (local_40 == 1)))) {
          bVar8 = *(int *)((long)local_8 + 0x24) == 2;
          if (!bVar8) {
            local_74 = 0x44;
          }
        }
        else if ((bVar8) && ((local_10->opcode == 0x127 || (local_10->opcode == 0x12d)))) {
          bVar9 = *(int *)((long)local_8 + 0x24) != 2;
          if (bVar9) {
            local_74 = 0x47;
          }
          bVar8 = !bVar9 && bVar8;
        }
      }
      if ((!bVar8) && (local_74 != 0xff)) {
        strcat_WSR(&local_20,_REGISTERS + (int)local_74);
        *local_20 = ':';
        local_20 = local_20 + 1;
      }
      strcat_WSR(&local_20,_REGISTERS + local_10->ops[local_40].index);
      distorm_format_signed_disp
                ((uchar **)CONCAT44(local_74,in_stack_ffffffffffffffa0),
                 (_DInst *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff90);
      *local_20 = ']';
      local_20 = local_20 + 1;
    }
    else if (uVar3 == '\a') {
      distorm_format_size(&local_20,local_10,local_40);
      *local_20 = '[';
      local_20 = local_20 + 1;
      if (local_10->segment < 0x81) {
        strcat_WSR(&local_20,_REGISTERS + (int)(local_10->segment & 0x7f));
        *local_20 = ':';
        local_20 = local_20 + 1;
      }
      if (local_10->base != 0xff) {
        strcat_WSR(&local_20,_REGISTERS + local_10->base);
        *local_20 = '+';
        local_20 = local_20 + 1;
      }
      strcat_WSR(&local_20,_REGISTERS + local_10->ops[local_40].index);
      if (local_10->scale != '\0') {
        uVar3 = local_10->scale;
        if (uVar3 == '\x02') {
          local_20[0] = '*';
          local_20[1] = '2';
          local_20 = local_20 + 2;
        }
        else if (uVar3 == '\x04') {
          local_20[0] = '*';
          local_20[1] = '4';
          local_20 = local_20 + 2;
        }
        else if (uVar3 == '\b') {
          local_20[0] = '*';
          local_20[1] = '8';
          local_20 = local_20 + 2;
        }
      }
      distorm_format_signed_disp
                ((uchar **)CONCAT44(local_74,in_stack_ffffffffffffffa0),
                 (_DInst *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 in_stack_ffffffffffffff90);
      *local_20 = ']';
      local_20 = local_20 + 1;
    }
    else if (uVar3 == '\t') {
      str_int_impl(&local_20,(ulong)(local_10->imm).word);
      *local_20 = ':';
      local_20 = local_20 + 1;
      str_int_impl(&local_20,(ulong)(local_10->imm).ptr.off);
    }
    else if (uVar3 == '\x03') {
      str_int_impl(&local_20,(ulong)(local_10->imm).dword);
    }
    else if (uVar3 == '\x04') {
      str_int_impl(&local_20,(ulong)(local_10->imm).ptr.off);
    }
  }
LAB_0010544d:
  *local_20 = '\0';
  *(int *)(local_18 + 8) = (int)local_20 - ((int)local_18 + 0x44);
  uVar5 = (uint)local_10->opcode;
  uVar6 = (int)(short)local_10->flags & 7;
  bVar1 = local_10->size;
  uVar4 = local_10->addr;
  local_20 = (uint8_t *)(local_18 + 2);
  if (uVar6 != 0) {
    uVar6 = (uint)(uVar5 == 0x13f) + (uVar5 == 0x12d) + uVar6;
    *(uint8_t (*) [8])local_20 = prefixTable[uVar6];
    local_20 = local_20 + prefixSizesTable[uVar6];
  }
  *(uint8_t (*) [8])local_20 = *(uint8_t (*) [8])("\tUNDEFINED" + (ulong)uVar5 + 1);
  *(uint8_t (*) [8])(local_20 + 8) = *(uint8_t (*) [8])("\tUNDEFINED" + (ulong)uVar5 + 9);
  puVar7 = local_20 + (int)(uint)"\tUNDEFINED"[uVar5];
  local_20 = puVar7;
  if (0 < (int)local_3c) {
    local_20 = puVar7 + 1;
    *puVar7 = suffixTable[(int)local_3c];
  }
  *local_20 = '\0';
  *(int *)((long)local_18 + 0xc) = (int)local_20 - ((int)local_18 + 0x10);
  *local_18 = uVar4 & local_30;
  *(uint *)(local_18 + 1) = (uint)bVar1;
  return;
}

Assistant:

_DLLEXPORT_ void distorm_format64(const _CodeInfo* ci, const _DInst* di, _DecodedInst* result)
#else
	_DLLEXPORT_ void distorm_format32(const _CodeInfo* ci, const _DInst* di, _DecodedInst* result)
#endif
{
	unsigned char* str;
	int64_t tmpDisp64;
	uint64_t addrMask = (uint64_t)-1;
	const _WMnemonic* mnemonic;
	int suffixSize = -1;
	unsigned int i;

	/* Set address mask, when default is for 64bits addresses. */
	if (ci->features & DF_USE_ADDR_MASK) addrMask = ci->addrMask;
	else {
		if (ci->features & DF_MAXIMUM_ADDR32) addrMask = 0xffffffff;
		else if (ci->features & DF_MAXIMUM_ADDR16) addrMask = 0xffff;
	}

	/* Gotta have full address for (di->addr - ci->codeOffset) to work in all modes. */
	str_hex(&result->instructionHex, (const uint8_t*)&ci->code[(unsigned int)(di->addr - ci->codeOffset)], di->size);

	if ((int)((int16_t)di->flags) == -1) {
		/* In-place considerations: DI is RESULT. Deref fields first. */
		unsigned int size = di->size;
		unsigned int byte = di->imm.byte;
		_OffsetType offset = di->addr & addrMask;

		result->offset = offset;
		result->size = size;
		str = (unsigned char*)&result->mnemonic.p;
		strcat_WS(str, "DB  ", 4, 3);
		str_int(&str, byte);
		strfinalize_WS(result->mnemonic, str);
		*(uint64_t*)&result->operands = 0; /* Clears length and the string at once. */
		return; /* Skip to next instruction. */
	}

	str = (unsigned char*)&result->operands.p;

	/* Special treatment for String (movs, cmps, stos, lods, scas) instructions. */
	if ((di->opcode >= I_MOVS) && (di->opcode <= I_SCAS)) {
		/*
		 * No operands are needed if the address size is the default one,
		 * and no segment is overridden, so add the suffix letter,
		 * to indicate size of operation and continue to next instruction.
		 */
		if ((SEGMENT_IS_DEFAULT_OR_NONE(di->segment)) && (FLAG_GET_ADDRSIZE(di->flags) == ci->dt)) {
			suffixSize = di->ops[0].size / 8;
			goto skipOperands;
		}
		suffixSize = 0; /* Marks it's a string instruction. */
	}

	for (i = 0; i < di->opsNo; i++) {
		unsigned int type = di->ops[i].type;
		if (i > 0) strcat_WS(str, ", ", 2, 2);
		if (type == O_REG) {
			strcat_WSR(&str, &_REGISTERS[di->ops[i].index]);
		}
		else if (type == O_IMM) {
			/* If the instruction is 'push', show explicit size (except byte imm). */
			if ((di->opcode == I_PUSH) && (di->ops[i].size != 8)) distorm_format_size(&str, di, i);
			/* Special fix for negative sign extended immediates. */
			if ((di->flags & FLAG_IMM_SIGNED) && (di->ops[i].size == 8) && (di->imm.sbyte < 0)) {
				chrcat_WS(str, MINUS_DISP_CHR);
				tmpDisp64 = -di->imm.sbyte;
				str_int(&str, tmpDisp64);
			}
			else {
				/* Notice signedness and size of the immediate. */
				if (di->ops[i].size == 0x20) str_int(&str, di->imm.dword);
				else str_int(&str, di->imm.qword);
			}
		}
		else if (type == O_PC) {
#ifdef SUPPORT_64BIT_OFFSET
			str_int(&str, (di->size + di->imm.sqword + di->addr) & addrMask);
#else
			tmpDisp64 = ((_OffsetType)di->imm.sdword + di->addr + di->size) & (uint32_t)addrMask;
			str_int(&str, tmpDisp64);
#endif
		}
		else if (type == O_DISP) {
			distorm_format_size(&str, di, i);
			chrcat_WS(str, OPEN_CHR);
			if (!SEGMENT_IS_DEFAULT_OR_NONE(di->segment)) {
				strcat_WSR(&str, &_REGISTERS[SEGMENT_GET_UNSAFE(di->segment)]);
				chrcat_WS(str, SEG_OFF_CHR);
			}
			tmpDisp64 = di->disp & addrMask;
			str_int(&str, tmpDisp64);
			chrcat_WS(str, CLOSE_CHR);
		}
		else if (type == O_SMEM) {
			int isDefault;
			int segment;
			distorm_format_size(&str, di, i);
			chrcat_WS(str, OPEN_CHR);

			segment = SEGMENT_GET(di->segment);
			isDefault = SEGMENT_IS_DEFAULT(di->segment);

			/*
			 * This is where we need to take special care for String instructions.
			 * If we got here, it means we need to explicitly show their operands.
			 * The problem with CMPS and MOVS is that they have two(!) memory operands.
			 * So we have to complement(!) them ourselves, since the isntruction structure supplies only the segment that can be overridden.
			 * And make the rest of the String operations explicit.
			 * We ignore default ES/DS in 64 bits.
			 * ["MOVS"], [OPT.REGI_EDI, OPT.REGI_ESI] -- DS can be overridden.
			 * ["CMPS"], [OPT.REGI_ESI, OPT.REGI_EDI] -- DS can be overriden.
			 *
			 * suffixSize == 0 was set above for string opcode already.
			 */
			if (suffixSize == 0) {
				if (((di->opcode == I_MOVS) && (i == 0)) || ((di->opcode == I_CMPS) && (i == 1))) {
					if (ci->dt != Decode64Bits) {
						segment = R_ES;
						isDefault = FALSE;
					}
					else isDefault = TRUE;
				}
				else if (isDefault && ((di->opcode == I_MOVS) || (di->opcode == I_CMPS))) {
					if (ci->dt != Decode64Bits) {
						segment = R_DS;
						isDefault = FALSE;
					}
				}
			}
			if (!isDefault && (segment != R_NONE)) {
				strcat_WSR(&str, &_REGISTERS[segment]);
				chrcat_WS(str, SEG_OFF_CHR);
			}

			strcat_WSR(&str, &_REGISTERS[di->ops[i].index]);

			distorm_format_signed_disp(&str, di, addrMask);
			chrcat_WS(str, CLOSE_CHR);
		}
		else if (type == O_MEM) {
			distorm_format_size(&str, di, i);
			chrcat_WS(str, OPEN_CHR);
			if (!SEGMENT_IS_DEFAULT_OR_NONE(di->segment)) {
				strcat_WSR(&str, &_REGISTERS[SEGMENT_GET_UNSAFE(di->segment)]);
				chrcat_WS(str, SEG_OFF_CHR);
			}
			if (di->base != R_NONE) {
				strcat_WSR(&str, &_REGISTERS[di->base]);
				chrcat_WS(str, PLUS_DISP_CHR);
			}
			strcat_WSR(&str, &_REGISTERS[di->ops[i].index]);
			if (di->scale != 0) {
				switch (di->scale)
				{
					case 2: strcat_WS(str, "*2", 2, 2); break;
					case 4: strcat_WS(str, "*4", 2, 2); break;
					case 8: strcat_WS(str, "*8", 2, 2); break;
				}
			}
			distorm_format_signed_disp(&str, di, addrMask);
			chrcat_WS(str, CLOSE_CHR);
		}
		else if (type == O_PTR) {
			str_int(&str, di->imm.ptr.seg);
			chrcat_WS(str, SEG_OFF_CHR);
			str_int(&str, di->imm.ptr.off);
		}
		else if (type == O_IMM1) {
			str_int(&str, di->imm.ex.i1);
		}
		else if (type == O_IMM2) {
			str_int(&str, di->imm.ex.i2);
		}
	}

skipOperands:

	/* Finalize the operands string. */
	strfinalize_WS(result->operands, str);

	/* Not used anymore.
	if (di->flags & FLAG_HINT_TAKEN) strcat_WSN(str, " ;TAKEN");
	else if (di->flags & FLAG_HINT_NOT_TAKEN) strcat_WSN(str, " ;NOT TAKEN");
	*/
	{
		/* In-place considerations: DI is RESULT. Deref fields first. */
		unsigned int opcode = di->opcode;
		unsigned int prefix = FLAG_GET_PREFIX(di->flags);
		unsigned int size = di->size;
		_OffsetType offset = di->addr & addrMask;
		str = (unsigned char*)&result->mnemonic.p;
		mnemonic = (const _WMnemonic*)&_MNEMONICS[opcode];

		if (prefix) {
			/* REP prefix for CMPS and SCAS is really a REPZ. */
			prefix += (opcode == I_CMPS);
			prefix += (opcode == I_SCAS);
			memcpy(str, &prefixTable[prefix][0], 8);
			str += prefixSizesTable[prefix];
		}

		/*
		 * Always copy 16 bytes from the mnemonic, we have a sentinel padding so we can read past.
		 * This helps the compiler to remove the call to memcpy and therefore makes this copying much faster.
		 * The longest instruction is exactly 16 chars long, so we null terminate the string below.
		 */
		memcpy((int8_t*)str, mnemonic->p, 16);
		str += mnemonic->length;

		if (suffixSize > 0) {
			*str++ = suffixTable[suffixSize];
		}
		strfinalize_WS(result->mnemonic, str);

		result->offset = offset;
		result->size = size;
	}
}